

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::x86::X86BufferWriter::emitImmediate
          (X86BufferWriter *this,uint64_t immValue,FastUInt8 immSize)

{
  byte in_DL;
  ulong in_RSI;
  CodeWriter *in_RDI;
  uint64_t imm;
  undefined8 local_20;
  undefined1 local_11;
  
  local_20 = in_RSI;
  local_11 = in_DL;
  if (3 < in_DL) {
    CodeWriter::emit32uLE<unsigned_long>(in_RDI,in_RSI & 0xffffffff);
    local_20 = in_RSI >> 0x20;
    local_11 = in_DL - 4;
  }
  if (local_11 != 0) {
    CodeWriter::emit8<unsigned_long>(in_RDI,local_20 & 0xff);
    if (local_11 != 1) {
      CodeWriter::emit8<unsigned_long>(in_RDI,local_20 >> 8 & 0xff);
      if (local_11 != 2) {
        CodeWriter::emit8<unsigned_long>(in_RDI,local_20 >> 0x10 & 0xff);
        if (local_11 != 3) {
          CodeWriter::emit8<unsigned_long>(in_RDI,local_20 >> 0x18 & 0xff);
        }
      }
    }
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void emitImmediate(uint64_t immValue, FastUInt8 immSize) noexcept {
#if ASMJIT_ARCH_BITS >= 64
    uint64_t imm = immValue;
    if (immSize >= 4) {
      emit32uLE(imm & 0xFFFFFFFFu);
      imm >>= 32;
      immSize = FastUInt8(immSize - 4u);
    }
#else
    uint32_t imm = uint32_t(immValue & 0xFFFFFFFFu);
    if (immSize >= 4) {
      emit32uLE(imm);
      imm = uint32_t(immValue >> 32);
      immSize = FastUInt8(immSize - 4u);
    }
#endif

    if (!immSize)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
  }